

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O0

void __thiscall irr::scene::CSkinnedMesh::resetAnimation(CSkinnedMesh *this)

{
  uint uVar1;
  u32 uVar2;
  int iVar3;
  SWeight *pSVar4;
  SSkinMeshBuffer **ppSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long in_RDI;
  u32 vertex_id;
  u16 buffer_id;
  u32 j;
  SJoint *joint;
  u32 i;
  SWeight *in_stack_ffffffffffffffb8;
  u32 index;
  SWeight *in_stack_ffffffffffffffc0;
  uint local_1c;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    uVar2 = core::array<irr::scene::ISkinnedMesh::SJoint_*>::size
                      ((array<irr::scene::ISkinnedMesh::SJoint_*> *)0x2a2631);
    if (uVar2 <= local_c) break;
    core::array<irr::scene::ISkinnedMesh::SJoint_*>::operator[]
              ((array<irr::scene::ISkinnedMesh::SJoint_*> *)in_stack_ffffffffffffffc0,
               (u32)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    local_1c = 0;
    while( true ) {
      uVar2 = core::array<irr::scene::ISkinnedMesh::SWeight>::size
                        ((array<irr::scene::ISkinnedMesh::SWeight> *)0x2a267a);
      index = (u32)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      if (uVar2 <= local_1c) break;
      core::array<irr::scene::ISkinnedMesh::SWeight>::operator[]
                ((array<irr::scene::ISkinnedMesh::SWeight> *)in_stack_ffffffffffffffc0,index);
      pSVar4 = core::array<irr::scene::ISkinnedMesh::SWeight>::operator[]
                         ((array<irr::scene::ISkinnedMesh::SWeight> *)in_stack_ffffffffffffffc0,
                          index);
      uVar1 = pSVar4->vertex_id;
      in_stack_ffffffffffffffb8 =
           core::array<irr::scene::ISkinnedMesh::SWeight>::operator[]
                     ((array<irr::scene::ISkinnedMesh::SWeight> *)in_stack_ffffffffffffffc0,index);
      ppSVar5 = core::array<irr::scene::SSkinMeshBuffer_*>::operator[]
                          ((array<irr::scene::SSkinMeshBuffer_*> *)in_stack_ffffffffffffffc0,
                           (u32)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      iVar3 = (*((*ppSVar5)->super_IMeshBuffer)._vptr_IMeshBuffer[0x21])(*ppSVar5,(ulong)uVar1);
      *(undefined8 *)CONCAT44(extraout_var,iVar3) =
           *(undefined8 *)&in_stack_ffffffffffffffb8->StaticPos;
      *(float *)((undefined8 *)CONCAT44(extraout_var,iVar3) + 1) =
           (in_stack_ffffffffffffffb8->StaticPos).Z;
      in_stack_ffffffffffffffc0 =
           core::array<irr::scene::ISkinnedMesh::SWeight>::operator[]
                     ((array<irr::scene::ISkinnedMesh::SWeight> *)in_stack_ffffffffffffffc0,
                      (u32)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      ppSVar5 = core::array<irr::scene::SSkinMeshBuffer_*>::operator[]
                          ((array<irr::scene::SSkinMeshBuffer_*> *)in_stack_ffffffffffffffc0,
                           (u32)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      iVar3 = (*((*ppSVar5)->super_IMeshBuffer)._vptr_IMeshBuffer[0x21])(*ppSVar5,(ulong)uVar1);
      *(undefined8 *)(CONCAT44(extraout_var_00,iVar3) + 0xc) =
           *(undefined8 *)&in_stack_ffffffffffffffc0->StaticNormal;
      *(float *)(CONCAT44(extraout_var_00,iVar3) + 0x14) =
           (in_stack_ffffffffffffffc0->StaticNormal).Z;
      local_1c = local_1c + 1;
    }
    local_c = local_c + 1;
  }
  *(undefined1 *)(in_RDI + 0xb4) = 0;
  *(undefined4 *)(in_RDI + 0xb0) = 0xbf800000;
  return;
}

Assistant:

void CSkinnedMesh::resetAnimation()
{
	// copy from the cache to the mesh...
	for (u32 i = 0; i < AllJoints.size(); ++i) {
		SJoint *joint = AllJoints[i];
		for (u32 j = 0; j < joint->Weights.size(); ++j) {
			const u16 buffer_id = joint->Weights[j].buffer_id;
			const u32 vertex_id = joint->Weights[j].vertex_id;
			LocalBuffers[buffer_id]->getVertex(vertex_id)->Pos = joint->Weights[j].StaticPos;
			LocalBuffers[buffer_id]->getVertex(vertex_id)->Normal = joint->Weights[j].StaticNormal;
		}
	}
	SkinnedLastFrame = false;
	LastAnimatedFrame = -1;
}